

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

string * __thiscall pbrt::Array2D<float>::ToString_abi_cxx11_(Array2D<float> *this)

{
  int *in_RSI;
  string *in_RDI;
  float value;
  int x;
  int y;
  string *s;
  string *this_00;
  Bounds2<int> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int local_28;
  int local_18;
  
  this_00 = in_RDI;
  StringPrintf<pbrt::Bounds2<int>const&>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  for (local_18 = in_RSI[1]; local_18 < in_RSI[3]; local_18 = local_18 + 1) {
    std::__cxx11::string::operator+=((string *)in_RDI," [ ");
    for (local_28 = *in_RSI; local_28 < in_RSI[2]; local_28 = local_28 + 1) {
      operator()((Array2D<float> *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      StringPrintf<float&>(in_stack_ffffffffffffffb8,(float *)in_stack_ffffffffffffffb0);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
    std::__cxx11::string::operator+=((string *)in_RDI,"], ");
  }
  std::__cxx11::string::operator+=((string *)in_RDI," ] ]");
  return this_00;
}

Assistant:

std::string ToString() const {
        std::string s = StringPrintf("[ Array2D extent: %s values: [", extent);
        for (int y = extent.pMin.y; y < extent.pMax.y; ++y) {
            s += " [ ";
            for (int x = extent.pMin.x; x < extent.pMax.x; ++x) {
                T value = (*this)(x, y);
                s += StringPrintf("%s, ", value);
            }
            s += "], ";
        }
        s += " ] ]";
        return s;
    }